

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_msg.h
# Opt level: O3

void __thiscall nodecpp::platform::internal_msg::InternalMsg::implReleaseAllPages(InternalMsg *this)

{
  ulong uVar1;
  size_t sVar2;
  long *__ptr;
  ulong uVar3;
  
  if (this->pageCnt != 0) {
    uVar1 = 0;
    do {
      free((this->firstHeader).firstPages[uVar1].ptr);
      uVar3 = uVar1 + 1;
      if (2 < uVar1) break;
      uVar1 = uVar3;
    } while (uVar3 < this->pageCnt);
    sVar2 = this->pageCnt - uVar3;
    this->pageCnt = sVar2;
    if (sVar2 != 0) {
      __ptr = (long *)(this->firstHeader).super_IndexPageHeader.next_.ptr;
      if (__ptr == (long *)0x0) {
        assert::onAssertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                   ,0xa0,"firstHeader.next() != nullptr",true);
        __ptr = (long *)(this->firstHeader).super_IndexPageHeader.next_.ptr;
        if (__ptr == (long *)0x0) {
          return;
        }
      }
      do {
        uVar1 = this->pageCnt;
        if ((uVar1 < 5) && (*__ptr != 0)) {
          assert::onAssertionFailed
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                     ,0xa3,"pageCnt > localStorageSize || firstHeader.next()->next() == nullptr",
                     true);
          __ptr = (long *)(this->firstHeader).super_IndexPageHeader.next_.ptr;
          uVar1 = this->pageCnt;
        }
        uVar3 = __ptr[1];
        if (uVar1 < uVar3) {
          assert::onAssertionFailed
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                     ,0xa4,"firstHeader.next()->usedCnt <= pageCnt",true);
          __ptr = (long *)(this->firstHeader).super_IndexPageHeader.next_.ptr;
          uVar3 = __ptr[1];
        }
        if (uVar3 == 0) {
          uVar1 = 0;
        }
        else {
          uVar3 = 0;
          do {
            free((void *)__ptr[uVar3 + 2]);
            uVar3 = uVar3 + 1;
            __ptr = (long *)(this->firstHeader).super_IndexPageHeader.next_.ptr;
            uVar1 = __ptr[1];
          } while (uVar3 < uVar1);
        }
        this->pageCnt = this->pageCnt - uVar1;
        (this->firstHeader).super_IndexPageHeader.next_.ptr = (uint8_t *)*__ptr;
        free(__ptr);
        __ptr = (long *)(this->firstHeader).super_IndexPageHeader.next_.ptr;
      } while (__ptr != (long *)0x0);
    }
  }
  return;
}

Assistant:

void implReleaseAllPages()
		{
			size_t i;
			for ( i=0; i<localStorageSize && i<pageCnt; ++i )
				implReleasePageWrapper( firstHeader.firstPages[i] );
			pageCnt -= i;
			if ( pageCnt )
			{
				NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, firstHeader.next() != nullptr );
				while ( firstHeader.next() != nullptr )
				{
					NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, pageCnt > localStorageSize || firstHeader.next()->next() == nullptr );
					NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, firstHeader.next()->usedCnt <= pageCnt );
					for ( size_t j=0; j<firstHeader.next()->usedCnt; ++j )
						implReleasePageWrapper( firstHeader.next()->pages()[j] );
					pageCnt -= firstHeader.next()->usedCnt;
					PagePointer page = firstHeader.next_;
					firstHeader.next_ = firstHeader.next()->next_;
					implReleasePageWrapper( page );
				}
			}
		}